

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScanMD.cpp
# Opt level: O1

StackSym * __thiscall
LinearScanMD::EnsureSpillSymForXmmReg(LinearScanMD *this,RegNum reg,Func *func,IRType type)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  StackSym *stackSym;
  undefined7 in_register_00000031;
  ulong uVar4;
  long lVar5;
  
  uVar4 = CONCAT71(in_register_00000031,reg) & 0xffffffff;
  if (0xf < (byte)(reg - RegXMM0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LinearScanMD.cpp"
                       ,0x3b,"(((reg) >= RegXMM0 && (reg) <= RegXMM15))","REGNUM_ISXMMXREG(reg)");
    if (!bVar2) goto LAB_006492c0;
    *puVar3 = 0;
  }
  lVar5 = 0x128;
  if ((type != TyFloat32) && (lVar5 = 0xa8, type != TyFloat64)) {
    bVar2 = IRType_IsSimd128(type);
    lVar5 = 0x28;
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LinearScanMD.cpp"
                         ,0x49,"(IRType_IsSimd128(type))","IRType_IsSimd128(type)");
      if (!bVar2) goto LAB_006492c0;
      *puVar3 = 0;
    }
  }
  stackSym = *(StackSym **)((long)this + uVar4 * 8 + lVar5 + -0x88);
  if (stackSym == (StackSym *)0x0) {
    stackSym = StackSym::New(type,func);
    Func::StackAllocate(func,stackSym,TySize[type]);
    lVar5 = 0x128;
    if ((type != TyFloat32) && (lVar5 = 0xa8, type != TyFloat64)) {
      bVar2 = IRType_IsSimd128(type);
      lVar5 = 0x28;
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LinearScanMD.cpp"
                           ,0x5e,"(IRType_IsSimd128(type))","IRType_IsSimd128(type)");
        if (!bVar2) {
LAB_006492c0:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar3 = 0;
      }
    }
    *(StackSym **)((long)this + uVar4 * 8 + lVar5 + -0x88) = stackSym;
  }
  return stackSym;
}

Assistant:

StackSym *
LinearScanMD::EnsureSpillSymForXmmReg(RegNum reg, Func *func, IRType type)
{
    Assert(REGNUM_ISXMMXREG(reg));

    __analysis_assume(reg - FIRST_XMM_REG < XMM_REGCOUNT);
    StackSym *sym;
    if (type == TyFloat32)
    {
        sym = this->xmmSymTable32[reg - FIRST_XMM_REG];
    }
    else if (type == TyFloat64)
    {
        sym = this->xmmSymTable64[reg - FIRST_XMM_REG];
    }
    else
    {
        Assert(IRType_IsSimd128(type));
        sym = this->xmmSymTable128[reg - FIRST_XMM_REG];
    }

    if (sym == nullptr)
    {
        sym = StackSym::New(type, func);
        func->StackAllocate(sym, TySize[type]);

        __analysis_assume(reg - FIRST_XMM_REG < XMM_REGCOUNT);

        if (type == TyFloat32)
        {
            this->xmmSymTable32[reg - FIRST_XMM_REG] = sym;
        }
        else if (type == TyFloat64)
        {
            this->xmmSymTable64[reg - FIRST_XMM_REG] = sym;
        }
        else
        {
            Assert(IRType_IsSimd128(type));
            this->xmmSymTable128[reg - FIRST_XMM_REG] = sym;
        }
    }

    return sym;
}